

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

void __thiscall
embree::HairMaterial::HairMaterial(HairMaterial *this,Vec3fa *Kr,Vec3fa *Kt,float nx,float ny)

{
  undefined8 uVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  SceneGraph::Node::Node((Node *)this,&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002c7808;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002c7e80;
  (this->base).type = 9;
  uVar1 = *(undefined8 *)((long)&Kr->field_0 + 8);
  *(undefined8 *)&(this->Kr).field_0 = *(undefined8 *)&Kr->field_0;
  *(undefined8 *)((long)&(this->Kr).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Kt->field_0 + 8);
  *(undefined8 *)&(this->Kt).field_0 = *(undefined8 *)&Kt->field_0;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = uVar1;
  this->nx = nx;
  this->ny = ny;
  return;
}

Assistant:

HairMaterial (const Vec3fa& Kr, const Vec3fa& Kt, float nx, float ny)
      : base(MATERIAL_HAIR), Kr(Kr), Kt(Kt), nx(nx), ny(ny) {}